

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

bool __thiscall llvm::FoldingSetNodeID::operator==(FoldingSetNodeID *this,FoldingSetNodeIDRef RHS)

{
  int iVar1;
  
  if ((ulong)(this->Bits).super_SmallVectorImpl<unsigned_int>.
             super_SmallVectorTemplateBase<unsigned_int,_true>.
             super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size ==
      RHS.Size) {
    iVar1 = bcmp((this->Bits).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
                 RHS.Data,RHS.Size << 2);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

size_t size() const { return Size; }